

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void Repeat(CScheduler *s,Function *f,milliseconds delta)

{
  Function f_00;
  long in_FS_OFFSET;
  CScheduler *pCVar1;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  _Manager_type in_stack_ffffffffffffffa0;
  _Invoker_type p_Stack_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _GLOBAL__N_1::std::function<void_()>::operator()((function<void_()> *)f);
  pCVar1 = s;
  std::function<void_()>::function((function<void_()> *)&stack0xffffffffffffff90,f);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x30);
  *(CScheduler **)local_48._M_unused._0_8_ = pCVar1;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_48._M_unused._0_8_ + 0x20) = p_Stack_58;
  if (in_stack_ffffffffffffffa0 != (_Manager_type)0x0) {
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = in_stack_ffffffffffffff90;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = in_stack_ffffffffffffff98;
    *(_Manager_type *)((long)local_48._M_unused._0_8_ + 0x18) = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffffa0 = (_Manager_type)0x0;
  }
  *(rep *)((long)local_48._M_unused._0_8_ + 0x28) = delta.__r;
  pcStack_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp:105:23)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp:105:23)>
             ::_M_manager;
  f_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff90;
  f_00.super__Function_base._M_functor._M_unused._M_object = pCVar1;
  f_00.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff98;
  f_00._M_invoker = (_Invoker_type)in_stack_ffffffffffffffa0;
  CScheduler::scheduleFromNow(s,f_00,(milliseconds)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Repeat(CScheduler& s, CScheduler::Function f, std::chrono::milliseconds delta)
{
    f();
    s.scheduleFromNow([=, &s] { Repeat(s, f, delta); }, delta);
}